

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

uint gl4cts::ShaderSubroutine::Utils::getNumberOfComponentsForVariableType
               (_variable_type *variable_type)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((ulong)*variable_type < 0x1d) {
    uVar1 = *(uint *)(&DAT_01a603a0 + (ulong)*variable_type * 4);
  }
  return uVar1;
}

Assistant:

unsigned int Utils::getNumberOfComponentsForVariableType(const _variable_type& variable_type)
{
	unsigned int result = 0;

	switch (variable_type)
	{
	case VARIABLE_TYPE_BOOL:
	case VARIABLE_TYPE_DOUBLE:
	case VARIABLE_TYPE_FLOAT:
	case VARIABLE_TYPE_INT:
	case VARIABLE_TYPE_UINT:
	{
		result = 1;

		break;
	}

	case VARIABLE_TYPE_BVEC2:
	case VARIABLE_TYPE_DVEC2:
	case VARIABLE_TYPE_IVEC2:
	case VARIABLE_TYPE_UVEC2:
	case VARIABLE_TYPE_VEC2:
	{
		result = 2;

		break;
	}

	case VARIABLE_TYPE_BVEC3:
	case VARIABLE_TYPE_DVEC3:
	case VARIABLE_TYPE_IVEC3:
	case VARIABLE_TYPE_UVEC3:
	case VARIABLE_TYPE_VEC3:
	{
		result = 3;

		break;
	}

	case VARIABLE_TYPE_BVEC4:
	case VARIABLE_TYPE_DVEC4:
	case VARIABLE_TYPE_IVEC4:
	case VARIABLE_TYPE_MAT2:
	case VARIABLE_TYPE_UVEC4:
	case VARIABLE_TYPE_VEC4:
	{
		result = 4;

		break;
	}

	case VARIABLE_TYPE_MAT2X3:
	case VARIABLE_TYPE_MAT3X2:
	{
		result = 6;

		break;
	}

	case VARIABLE_TYPE_MAT2X4:
	case VARIABLE_TYPE_MAT4X2:
	{
		result = 8;

		break;
	}

	case VARIABLE_TYPE_MAT3:
	{
		result = 9;

		break;
	}

	case VARIABLE_TYPE_MAT3X4:
	case VARIABLE_TYPE_MAT4X3:
	{
		result = 12;

		break;
	}

	case VARIABLE_TYPE_MAT4:
	{
		result = 16;

		break;
	}

	default:
		break;
	} /* switch (variable_type) */

	return result;
}